

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# succinctFMIndex.h
# Opt level: O1

void __thiscall bwtil::succinctFMIndex::loadFromFile(succinctFMIndex *this,FILE *fp)

{
  fread(&this->n,8,1,(FILE *)fp);
  fread(&this->sigma,4,1,(FILE *)fp);
  fread(&this->log_sigma,4,1,(FILE *)fp);
  fread(&this->offrate,8,1,(FILE *)fp);
  IndexedBWT::loadFromFile(&this->idxBWT,fp);
  return;
}

Assistant:

void loadFromFile(FILE *fp){

		ulint numBytes;

		numBytes = fread(&n, sizeof(ulint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&log_sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&offrate, sizeof(ulint), 1, fp);
		assert(numBytes>0);

		idxBWT.loadFromFile(fp);

		numBytes++;//avoids "variable not used" warning

	}